

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::setASTCErrorColorBlock
               (void *dst,int blockWidth,int blockHeight,bool isSRGB)

{
  undefined4 local_3c;
  int i_1;
  float *dstF;
  int i;
  deUint8 *dstU;
  bool isSRGB_local;
  int blockHeight_local;
  int blockWidth_local;
  void *dst_local;
  
  if (isSRGB) {
    for (dstF._4_4_ = 0; dstF._4_4_ < blockWidth * blockHeight; dstF._4_4_ = dstF._4_4_ + 1) {
      *(undefined1 *)((long)dst + (long)(dstF._4_4_ << 2)) = 0xff;
      *(undefined1 *)((long)dst + (long)(dstF._4_4_ * 4 + 1)) = 0;
      *(undefined1 *)((long)dst + (long)(dstF._4_4_ * 4 + 2)) = 0xff;
      *(undefined1 *)((long)dst + (long)(dstF._4_4_ * 4 + 3)) = 0xff;
    }
  }
  else {
    for (local_3c = 0; local_3c < blockWidth * blockHeight; local_3c = local_3c + 1) {
      *(undefined4 *)((long)dst + (long)(local_3c << 2) * 4) = 0x3f800000;
      *(undefined4 *)((long)dst + (long)(local_3c * 4 + 1) * 4) = 0;
      *(undefined4 *)((long)dst + (long)(local_3c * 4 + 2) * 4) = 0x3f800000;
      *(undefined4 *)((long)dst + (long)(local_3c * 4 + 3) * 4) = 0x3f800000;
    }
  }
  return;
}

Assistant:

inline void setASTCErrorColorBlock (void* dst, int blockWidth, int blockHeight, bool isSRGB)
{
	if (isSRGB)
	{
		deUint8* const dstU = (deUint8*)dst;

		for (int i = 0; i < blockWidth*blockHeight; i++)
		{
			dstU[4*i + 0] = 0xff;
			dstU[4*i + 1] = 0;
			dstU[4*i + 2] = 0xff;
			dstU[4*i + 3] = 0xff;
		}
	}
	else
	{
		float* const dstF = (float*)dst;

		for (int i = 0; i < blockWidth*blockHeight; i++)
		{
			dstF[4*i + 0] = 1.0f;
			dstF[4*i + 1] = 0.0f;
			dstF[4*i + 2] = 1.0f;
			dstF[4*i + 3] = 1.0f;
		}
	}
}